

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.h
# Opt level: O1

void __thiscall MeCab::FeatureIndex::~FeatureIndex(FeatureIndex *this)

{
  pointer ppcVar1;
  pointer piVar2;
  
  this->_vptr_FeatureIndex = (_func_int **)&PTR___cxa_pure_virtual_00172f40;
  StringBuffer::~StringBuffer(&this->os_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>_>_>
  ::~_Rb_tree(&(this->rewrite_).cache_._M_t);
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::~vector
            (&(this->rewrite_).right_rewrite_.
              super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>);
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::~vector
            (&(this->rewrite_).left_rewrite_.
              super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>);
  std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::~vector
            ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)
             &this->rewrite_);
  ppcVar1 = (this->bigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar1 != (pointer)0x0) {
    operator_delete(ppcVar1);
  }
  ppcVar1 = (this->unigram_templs_).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar1 != (pointer)0x0) {
    operator_delete(ppcVar1);
  }
  ChunkFreeList<char>::~ChunkFreeList(&this->char_freelist_);
  ChunkFreeList<int>::~ChunkFreeList(&this->feature_freelist_);
  piVar2 = (this->feature_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar2 != (pointer)0x0) {
    operator_delete(piVar2);
    return;
  }
  return;
}

Assistant:

virtual ~FeatureIndex() {}